

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_ptr.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer piVar1;
  uint uVar2;
  size_t sVar3;
  int *piVar4;
  pointer piVar5;
  pointer pVar6;
  ulong local_e0;
  size_t i_1;
  int local_c4;
  GlobalPtr<void> local_c0;
  allocator<int> local_9d;
  value_type_conflict local_9c;
  undefined1 local_98 [8];
  vector<int,_std::allocator<int>_> zeros;
  size_t i;
  int *local;
  GlobalPtr<int> local_60;
  int local_4c;
  GlobalPtr<int> local_48;
  GlobalPtr<int> local_38;
  undefined1 local_28 [8];
  GlobalPtr<int> ptr;
  char **argv_local;
  int argc_local;
  
  ptr.ptr = (size_t)argv;
  BCL::init((BCL *)0x100,(EVP_PKEY_CTX *)0x0);
  sVar3 = BCL::nprocs();
  if (sVar3 < 2) {
    __assert_fail("BCL::nprocs() >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/berkeley-container-library[P]bcl/examples/simple/global_ptr.cpp"
                  ,0x22,"int main(int, char **)");
  }
  BCL::GlobalPtr<int>::GlobalPtr((GlobalPtr<int> *)local_28,(nullptr_t)0x0);
  sVar3 = BCL::rank();
  if (sVar3 == 0) {
    sVar3 = BCL::nprocs();
    local_38 = BCL::alloc<int>(sVar3);
    local_28 = (undefined1  [8])local_38.rank;
    ptr.rank = local_38.ptr;
  }
  local_48 = BCL::broadcast<BCL::GlobalPtr<int>>((GlobalPtr<int> *)local_28,0);
  local_28 = (undefined1  [8])local_48.rank;
  ptr.rank = local_48.ptr;
  sVar3 = BCL::rank();
  local_4c = (int)sVar3;
  sVar3 = BCL::rank();
  local_60 = (GlobalPtr<int>)BCL::GlobalPtr<int>::operator[]((GlobalPtr<int> *)local_28,sVar3);
  BCL::GlobalRef<int>::operator=((GlobalRef<int> *)&local_60,&local_4c);
  BCL::barrier();
  sVar3 = BCL::rank();
  if (sVar3 == 0) {
    piVar4 = BCL::GlobalPtr<int>::local((GlobalPtr<int> *)local_28);
    printf("Rank 0 Sees:\n");
    for (zeros.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage = (pointer)0x0;
        piVar1 = zeros.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_end_of_storage, piVar5 = (pointer)BCL::nprocs(), piVar1 < piVar5;
        zeros.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)((long)zeros.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 1)) {
      printf("%lu: %d\n",
             zeros.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,
             (ulong)(uint)piVar4[(long)zeros.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage]);
    }
  }
  BCL::barrier();
  sVar3 = BCL::rank();
  if (sVar3 == 1) {
    sVar3 = BCL::nprocs();
    local_9c = 0;
    std::allocator<int>::allocator(&local_9d);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_98,sVar3,&local_9c,&local_9d);
    std::allocator<int>::~allocator(&local_9d);
    local_c0 = BCL::GlobalPtr<int>::operator_GlobalPtr<true,_nullptr>((GlobalPtr<int> *)local_28);
    piVar4 = std::vector<int,_std::allocator<int>_>::data
                       ((vector<int,_std::allocator<int>_> *)local_98);
    std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)local_98);
    BCL::memcpy((void *)local_c0.rank,(void *)local_c0.ptr,(size_t)piVar4);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_98);
  }
  BCL::barrier();
  sVar3 = BCL::rank();
  local_c4 = (int)sVar3;
  sVar3 = BCL::rank();
  pVar6 = BCL::GlobalPtr<int>::operator+((GlobalPtr<int> *)local_28,sVar3);
  BCL::rput<int>(&local_c4,pVar6);
  BCL::barrier();
  sVar3 = BCL::rank();
  if (sVar3 == 1) {
    printf("Rank 1 Sees:\n");
    for (local_e0 = 0; sVar3 = BCL::nprocs(), local_e0 < sVar3; local_e0 = local_e0 + 1) {
      pVar6 = BCL::GlobalPtr<int>::operator+((GlobalPtr<int> *)local_28,local_e0);
      uVar2 = BCL::rget<int>(pVar6);
      printf("%lu: %d\n",local_e0,(ulong)uVar2);
    }
  }
  BCL::finalize();
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  BCL::init();

  // Need to run this with at least two processes.
  assert(BCL::nprocs() >= 2);

  BCL::GlobalPtr<int> ptr = nullptr;

  if (BCL::rank() == 0) {
    ptr = BCL::alloc<int>(BCL::nprocs());
  }

  ptr = BCL::broadcast(ptr, 0);

  // 1) Using pointer dereference
  //    to write a value.
  ptr[BCL::rank()] = BCL::rank();

  BCL::barrier();

  if (BCL::rank() == 0) {
    // 2) Calling .local() to get a local pointer.
    int* local = ptr.local();

    printf("Rank 0 Sees:\n");
    for (size_t i = 0; i < BCL::nprocs(); i++) {
      printf("%lu: %d\n", i, local[i]);
    }
  }

  BCL::barrier();

  if (BCL::rank() == 1) {
    std::vector<int> zeros(BCL::nprocs(), 0);
    // 3) Using BCL::memcpy.
    BCL::memcpy(ptr, zeros.data(), sizeof(int)*zeros.size());
  }

  BCL::barrier();

  // 4) Using rput
  BCL::rput((int) BCL::rank(), ptr + BCL::rank());

  BCL::barrier();

  if (BCL::rank() == 1) {
    printf("Rank 1 Sees:\n");
    for (size_t i = 0; i < BCL::nprocs(); i++) {
      // 4) Using rget
      printf("%lu: %d\n", i, BCL::rget(ptr + i));
    }
  }

  BCL::finalize();
  return 0;
}